

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::vSolveUpdateRight
          (CLUFactor<double> *this,double *vec,int *ridx,int n,double eps)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  iVar2 = (this->l).firstUnused;
  iVar3 = (this->l).firstUpdate;
  lVar10 = (long)iVar3;
  if (iVar3 < iVar2) {
    pdVar5 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->l).idx;
    piVar7 = (this->l).row;
    piVar8 = (this->l).start;
    do {
      dVar1 = vec[piVar7[lVar10]];
      if (eps < ABS(dVar1)) {
        iVar3 = piVar8[lVar10];
        iVar9 = piVar8[lVar10 + 1];
        if (iVar3 < iVar9) {
          lVar11 = (long)iVar3 * 4;
          do {
            iVar4 = *(int *)((long)piVar6 + lVar11);
            ridx[n] = iVar4;
            n = n + (uint)(vec[iVar4] == 0.0);
            dVar13 = vec[iVar4] - *(double *)((long)pdVar5 + lVar11 * 2) * dVar1;
            uVar12 = -(ulong)(dVar13 != 0.0);
            vec[iVar4] = (double)(~uVar12 & 0x2b2bff2ee48e0530 | (ulong)dVar13 & uVar12);
            iVar9 = iVar9 + -1;
            lVar11 = lVar11 + 4;
          } while (iVar3 < iVar9);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}